

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<2>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  float *pfVar1;
  float *pfVar2;
  int i;
  int index;
  
  for (index = 0; index < *field; index = index + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    pfVar2 = RepeatedField<float>::Get((RepeatedField<float> *)field,index);
    pfVar1 = (float *)output->ptr;
    *pfVar1 = *pfVar2;
    output->ptr = (uint8_t *)(pfVar1 + 1);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }